

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O0

ostream * __thiscall Measurement::toString(Measurement *this,ostream *strm)

{
  Index IVar1;
  ostream *poVar2;
  CoeffReturnType pdVar3;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  ostream *strm_local;
  Measurement *this_local;
  
  local_1c = 0;
  while( true ) {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                      (&(this->estimate_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
    if (IVar1 <= local_1c) break;
    poVar2 = std::operator<<(strm,"\t");
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->estimate_,(long)local_1c);
    std::ostream::operator<<(poVar2,*pdVar3);
    local_1c = local_1c + 1;
  }
  poVar2 = std::operator<<(strm,"\t");
  std::ostream::operator<<(poVar2,this->nis_);
  local_20 = 0;
  while( true ) {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                      (&(this->ground_truth_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
    if (IVar1 <= local_20) break;
    poVar2 = std::operator<<(strm,"\t");
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->ground_truth_,(long)local_20);
    std::ostream::operator<<(poVar2,*pdVar3);
    local_20 = local_20 + 1;
  }
  std::operator<<(strm,"\n");
  return strm;
}

Assistant:

std::ostream& Measurement::toString(std::ostream &strm) const {
    // output the estimation
    for (int i=0; i<estimate_.rows(); i++)
        strm << "\t" << estimate_(i);

    strm << "\t" << nis_; // nis

    // output the ground truth packages
    for (int i=0; i<ground_truth_.rows(); i++)
        strm << "\t" << ground_truth_(i);

    strm << "\n";

    return strm;
}